

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> __thiscall
wabt::MakeUnique<wabt::FuncType,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  undefined8 *puVar1;
  string_view local_28;
  
  puVar1 = (undefined8 *)operator_new(0x80);
  local_28.data_ = (args->_M_dataplus)._M_p;
  local_28.size_ = args->_M_string_length;
  *puVar1 = &PTR__TypeEntry_001e0960;
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined8 *)((long)puVar1 + 0x14) = 0;
  *(undefined8 *)((long)puVar1 + 0x1c) = 0;
  string_view::to_string_abi_cxx11_((string *)(puVar1 + 5),&local_28);
  *(undefined4 *)(puVar1 + 9) = 0;
  *puVar1 = &PTR__FuncType_001e0918;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<wabt::FuncType,_std::default_delete<wabt::FuncType>,_true,_true>)
         (__uniq_ptr_data<wabt::FuncType,_std::default_delete<wabt::FuncType>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}